

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcFont.cpp
# Opt level: O1

int __thiscall GrcFont::ScanGlyfIds(GrcFont *this)

{
  iterator iVar1;
  bool bVar2;
  utf16 uVar3;
  uint uVar4;
  void *__s;
  ulong uVar5;
  GdlObject *in_RDX;
  GdlObject *extraout_RDX;
  GdlObject *extraout_RDX_00;
  GdlObject *extraout_RDX_01;
  GdlObject *extraout_RDX_02;
  GdlObject *extraout_RDX_03;
  GdlObject *extraout_RDX_04;
  GdlObject *pGVar6;
  GdlObject *extraout_RDX_05;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  uint nUni;
  uint local_40;
  uint local_3c;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_38;
  
  if (this->m_nMaxGlyfId == -1) {
    bVar2 = false;
    this->m_cnUnicode = 0;
    local_40 = 0;
    do {
      bVar9 = true;
      if ((local_40 & 0x1ffffe) != 0xfffe) {
        uVar3 = GlyphFromCmap(this,local_40,in_RDX);
        bVar9 = uVar3 == 0;
        in_RDX = extraout_RDX;
      }
      if (bVar9) {
        if (bVar2) {
          iVar1._M_current =
               (this->m_vnLimUnicode).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (this->m_vnLimUnicode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_vnLimUnicode,
                       iVar1,&local_40);
            in_RDX = extraout_RDX_00;
          }
          else {
            *iVar1._M_current = local_40;
            (this->m_vnLimUnicode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          bVar2 = false;
        }
      }
      else if (!bVar2) {
        iVar1._M_current =
             (this->m_vnMinUnicode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (this->m_vnMinUnicode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_vnMinUnicode,
                     iVar1,&local_40);
          in_RDX = extraout_RDX_01;
        }
        else {
          *iVar1._M_current = local_40;
          (this->m_vnMinUnicode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        bVar2 = true;
      }
      if (!bVar9) {
        this->m_cnUnicode = this->m_cnUnicode + 1;
      }
      local_40 = local_40 + 1;
    } while (local_40 < 0x10fffe);
    if (bVar2) {
      iVar1._M_current =
           (this->m_vnLimUnicode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->m_vnLimUnicode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_vnLimUnicode,iVar1,
                   &local_40);
      }
      else {
        *iVar1._M_current = local_40;
        (this->m_vnLimUnicode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
    }
    __s = operator_new__(0x40000);
    memset(__s,0,0x3fffc);
    this->m_nMaxGlyfId = 0;
    uVar7 = *(this->m_vnMinUnicode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar8 = (ulong)uVar7;
    if (uVar7 != 0xffffffff) {
      local_38 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_vnCollisions;
      pGVar6 = extraout_RDX_02;
      uVar5 = 0;
      do {
        uVar7 = (uint)uVar8;
        local_40 = uVar7;
        uVar3 = GlyphFromCmap(this,uVar7,pGVar6);
        pGVar6 = extraout_RDX_03;
        if (uVar3 != 0) {
          uVar8 = (ulong)uVar3;
          uVar4 = this->m_nMaxGlyfId;
          if ((int)uVar4 <= (int)(uint)uVar3) {
            uVar4 = (uint)uVar3;
          }
          this->m_nMaxGlyfId = uVar4;
          uVar4 = *(uint *)((long)__s + uVar8 * 4);
          if (uVar4 != 0xffff) {
            if (uVar4 == 0) {
              *(uint *)((long)__s + uVar8 * 4) = local_40;
              goto LAB_00164a1b;
            }
            iVar1._M_current =
                 (this->m_vnCollisions).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_3c = uVar4;
            if (iVar1._M_current ==
                (this->m_vnCollisions).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,iVar1,
                         &local_3c);
              pGVar6 = extraout_RDX_04;
            }
            else {
              *iVar1._M_current = uVar4;
              (this->m_vnCollisions).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
              ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
            }
            *(undefined4 *)((long)__s + uVar8 * 4) = 0xffff;
          }
          iVar1._M_current =
               (this->m_vnCollisions).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (this->m_vnCollisions).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(local_38,iVar1,&local_40);
            pGVar6 = extraout_RDX_05;
          }
          else {
            *iVar1._M_current = local_40;
            (this->m_vnCollisions).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
        }
LAB_00164a1b:
        if (uVar7 + 1 <
            (this->m_vnLimUnicode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar5 >> 0x20]) {
          uVar8 = (ulong)(uVar7 + 1) | uVar5 & 0xffffffff00000000;
        }
        else {
          uVar5 = (uVar5 >> 0x20) + 1;
          uVar8 = uVar5 & 0xffffffff;
          pGVar6 = (GdlObject *)
                   (this->m_vnMinUnicode).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (uVar8 < (ulong)((long)(this->m_vnMinUnicode).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pGVar6 >> 2))
          {
            uVar8 = (ulong)(uint)(&(pGVar6->m_lnf).m_nLinePre)[uVar8];
          }
          else {
            uVar8 = 0xffffffff;
          }
          uVar8 = uVar5 << 0x20 | uVar8;
        }
        uVar5 = uVar8;
      } while ((int)uVar8 != -1);
    }
    operator_delete__(__s);
  }
  return 1;
}

Assistant:

int GrcFont::ScanGlyfIds(void)
{
	Assert(m_pCmap_3_10 || m_pCmap_3_1);
	if (m_nMaxGlyfId != -1) // return if called more than once
		return true;

	// determine ranges of Unicode codepoints supported by this font
	// TODO: is there a more efficient way to do this?

	unsigned int nUni;
	bool fInUsedRange = false;
	m_cnUnicode = 0;
	for (nUni = 0; nUni <= 0x0010FFFD; nUni++)
	{
		utf16 gid;
		if (nUni == 0x0000FFFE || nUni == 0x0000FFFF) // invalid
			gid = 0;
		else
			gid = GlyphFromCmap(nUni, NULL);

        if (gid != 0 && !fInUsedRange)
		{
			// Record the beginning of the range
			m_vnMinUnicode.push_back(nUni);
			fInUsedRange = true;
		}
		else if (gid == 0 && fInUsedRange)
		{
			// Record the end of the range.
			m_vnLimUnicode.push_back(nUni);
			fInUsedRange = false;
		}
		if (gid != 0)
			m_cnUnicode++;
	}
	if (fInUsedRange)
		m_vnLimUnicode.push_back(nUni);
	Assert(m_vnLimUnicode.size() == m_vnMinUnicode.size());

	// create array indexed by glyf id containing unicode codepoints
	unsigned int *prgnUsed = new unsigned int[0x10000];
	if (!prgnUsed)
	{
		g_errorList.AddError(129, NULL,
			"Memory failure: could not allocate prgUsed array when scanning glyph ids");
		return false;
	}
	// initialize all elements to zero
	for (int ig = 0; ig < 0xFFFF; ig++)
		prgnUsed[ig] = 0;
	m_nMaxGlyfId = 0;

	// get glyf id for all unicode codepoints and look for collisions
	GrcFont::iterator fit;
	GrcFont::iterator fitEnd = this->End();
	for (fit = this->Begin(); fit != fitEnd; ++fit)
	{
		nUni = *fit;
		Assert(nUni != 0x0000FFFE);  // invalid
		Assert(nUni != 0x0000FFFF);  // invalid
		Assert(nUni != 0x0010FFFE);  // invalid
		Assert(nUni != 0x0010FFFF);  // invalid

		utf16 gid = GlyphFromCmap(nUni, NULL); // find glyf id
		if (gid == 0) // 0 - normally is default glyf id
		{
			Assert(false); // iterators only cover codepoints with valid glyph IDs
			continue;
		}
		m_nMaxGlyfId = max(m_nMaxGlyfId, static_cast<int>(gid)); // track largest glyf id
		if (!prgnUsed[gid]) // if this glyf id not seen yet
		{
			prgnUsed[gid] = nUni; // store current unicode id
		}
		else
		{
			// track Unicode ids that collide
			int nPrevUni = prgnUsed[gid];
			if (nPrevUni != 0x0000FFFF) 
			{
				// first collision - need to store both Unicode ids in array and current id
				m_vnCollisions.push_back(nPrevUni);
				// indicate one collision occurred, don't want to store array id if another
				// collision occurs; 0xFFFF is an illegal unicode value
				prgnUsed[gid] = 0x0000FFFF; 
			}
			m_vnCollisions.push_back(nUni); // store current unicode id always
		}
	}
	delete [] prgnUsed;
	return true;
}